

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O3

void __thiscall
LidarSensor::PredictMeasurement
          (LidarSensor *this,MatrixXd *Xsig_pred,VectorXd *weights_m,VectorXd *weights_c,
          MatrixXd *Zsig,VectorXd *z_pred,MatrixXd *S,bool modified)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  MatrixXd *pMVar3;
  double *pdVar4;
  ulong uVar5;
  undefined1 *puVar6;
  double dVar7;
  Index size;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  undefined1 *puVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  MatrixXd local_b8;
  MatrixXd *local_a0;
  MatrixXd *local_98;
  undefined1 *local_90;
  void *local_88;
  MatrixXd *pMStack_80;
  undefined1 *local_78;
  double local_70;
  ulong local_60;
  LidarSensor *local_58;
  VectorXd *local_50;
  MatrixXd *local_48;
  PlainObject *local_40;
  
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_a0 = (MatrixXd *)
             (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
  local_90 = (undefined1 *)0x0;
  local_58 = this;
  if ((long)local_a0 < 0) {
    pcVar14 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)z_pred,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_a0);
    pMVar3 = (MatrixXd *)
             (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (pMVar3 != local_a0) {
      pcVar14 = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
      ;
LAB_001197ca:
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,pcVar14);
    }
    uVar8 = (long)pMVar3 - ((long)pMVar3 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)pMVar3) {
      lVar16 = 0;
      do {
        pdVar4 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + lVar16;
        *pdVar4 = (double)local_90;
        pdVar4[1] = (double)local_90;
        lVar16 = lVar16 + 2;
      } while (lVar16 < (long)uVar8);
    }
    auVar20 = _DAT_00133420;
    auVar2 = _DAT_00133410;
    lVar16 = (long)pMVar3 % 2;
    if (lVar16 != 0 && (long)uVar8 <= (long)pMVar3) {
      pdVar4 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      lVar12 = lVar16 + -1;
      auVar19._8_4_ = (int)lVar12;
      auVar19._0_8_ = lVar12;
      auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar8 = 0;
      auVar19 = auVar19 ^ _DAT_00133420;
      do {
        auVar21._8_4_ = (int)uVar8;
        auVar21._0_8_ = uVar8;
        auVar21._12_4_ = (int)(uVar8 >> 0x20);
        auVar21 = (auVar21 | auVar2) ^ auVar20;
        if ((bool)(~(auVar21._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar21._0_4_ ||
                    auVar19._4_4_ < auVar21._4_4_) & 1)) {
          pdVar4[((long)pMVar3 / 2) * 2 + uVar8] = (double)local_90;
        }
        if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
            auVar21._12_4_ <= auVar19._12_4_) {
          pdVar4[((long)pMVar3 / 2) * 2 + uVar8 + 1] = (double)local_90;
        }
        uVar8 = uVar8 + 2;
      } while ((lVar16 + 1U & 0xfffffffffffffffe) != uVar8);
    }
    local_a0 = (MatrixXd *)
               (S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
    local_98 = (MatrixXd *)
               (S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols;
    local_90 = (undefined1 *)0x0;
    local_50 = weights_c;
    if (-1 < (long)((ulong)local_98 | (ulong)local_a0)) {
      iVar17 = (int)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols;
      local_60 = local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_cols & 0xffffffff;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)S,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_a0);
      if (0 < iVar17) {
        uVar18 = (uint)local_60;
        uVar8 = 0;
        do {
          uVar5 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
          if (((long)uVar5 < 1) ||
             ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_cols <= (long)uVar8)) {
LAB_0011971f:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x72,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1>, Level = 0]"
                         );
          }
          puVar6 = (undefined1 *)
                   (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          if (((long)puVar6 < 1) ||
             ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols <= (long)uVar8)) {
LAB_00119700:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x151,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                         );
          }
          pdVar4 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          pdVar9 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          pdVar9[(long)puVar6 * uVar8] = pdVar4[uVar5 * uVar8];
          if (uVar5 < 2) goto LAB_0011971f;
          if (puVar6 < (undefined1 *)0x2) goto LAB_00119700;
          pMVar3 = (MatrixXd *)(pdVar9 + (long)puVar6 * uVar8);
          (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows = (DenseIndex)pdVar4[uVar5 * uVar8 + 1];
          if ((weights_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= (long)uVar8) goto LAB_0011973e;
          if ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols <= (long)uVar8) goto LAB_0011975d;
          local_70 = (weights_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[uVar8];
          local_a0 = (MatrixXd *)z_pred;
          local_98 = pMVar3;
          local_90 = puVar6;
          pMStack_80 = Zsig;
          local_78 = puVar6;
          if ((undefined1 *)
              (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows != puVar6) {
            pcVar14 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
            ;
            goto LAB_00119895;
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)z_pred,
                     (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                      *)&local_a0);
          puVar6 = (undefined1 *)
                   (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows;
          if (puVar6 != local_90) {
            pcVar14 = 
            "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
            ;
            goto LAB_001197ca;
          }
          puVar13 = (undefined1 *)((long)puVar6 - ((long)puVar6 >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)puVar6) {
            lVar16 = 0;
            do {
              pdVar4 = (local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data + lVar16;
              auVar2 = *(undefined1 (*) [16])
                        (&(local_98->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_data + lVar16);
              auVar20._0_8_ = local_70 * auVar2._0_8_ + *pdVar4;
              auVar20._8_8_ = local_70 * auVar2._8_8_ + pdVar4[1];
              *(undefined1 (*) [16])
               ((z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data + lVar16) = auVar20;
              lVar16 = lVar16 + 2;
            } while (lVar16 < (long)puVar13);
          }
          if ((long)puVar13 < (long)puVar6) {
            pdVar4 = (local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data;
            pdVar9 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            do {
              pdVar9[(long)puVar13] =
                   (double)(&(local_98->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_data)[(long)puVar13] * local_70 + pdVar4[(long)puVar13];
              puVar13 = puVar13 + 1;
            } while (puVar6 != puVar13);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uVar18 & 0x7fffffff));
      }
      uVar8 = (ulong)modified;
      if ((int)(uint)modified <
          (int)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols) {
        lVar16 = (ulong)modified << 3;
        local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
             0x1fffffffffffffff;
        do {
          local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
               = (double *)0x0;
          local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
               = 0;
          pdVar4 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          uVar5 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                  .m_rows;
          if (modified) {
            if ((long)uVar5 < 0 && pdVar4 + uVar5 * uVar8 != (double *)0x0) {
LAB_00119796:
              __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                            ,0x94,
                            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                           );
            }
            if ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols <= (long)uVar8) goto LAB_0011975d;
            if (pdVar4 != (double *)0x0 && (long)uVar5 < 0) goto LAB_00119796;
            if ((long)uVar5 < 0) {
LAB_001197ee:
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                            ,0xf1,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            if (uVar5 == 0) {
              uVar10 = 0;
            }
            else {
              if (((ulong)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols < uVar5) ||
                 (pdVar9 = (double *)malloc(uVar5 * 8), pdVar9 == (double *)0x0)) {
                puVar11 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar11 = operator_delete;
                __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              uVar10 = uVar5 & 0x1ffffffffffffffe;
              local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = pdVar9;
              if (uVar5 != 1) {
                uVar15 = 0;
                do {
                  pdVar1 = (double *)((long)pdVar4 + uVar15 * 8 + uVar5 * lVar16);
                  dVar7 = pdVar1[1];
                  auVar2 = *(undefined1 (*) [16])(pdVar4 + uVar15);
                  pdVar9[uVar15] = *pdVar1 - auVar2._0_8_;
                  (pdVar9 + uVar15)[1] = dVar7 - auVar2._8_8_;
                  uVar15 = uVar15 + 2;
                } while (uVar15 < uVar10);
              }
            }
            if ((long)uVar10 < (long)uVar5) {
              do {
                local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data[uVar10] =
                     *(double *)((long)pdVar4 + uVar10 * 8 + uVar5 * lVar16) - pdVar4[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar5 != uVar10);
            }
          }
          else {
            if ((long)uVar5 < 0 && pdVar4 + uVar5 * uVar8 != (double *)0x0) goto LAB_00119796;
            if ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols <= (long)uVar8) {
LAB_0011975d:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                            ,0x76,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            if (uVar5 != (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows) {
              pcVar14 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_00119895;
            }
            if ((long)uVar5 < 0) goto LAB_001197ee;
            if (uVar5 == 0) {
              uVar10 = 0;
            }
            else {
              if (((ulong)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols < uVar5) ||
                 (pdVar9 = (double *)malloc(uVar5 * 8), pdVar9 == (double *)0x0)) {
                puVar11 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar11 = operator_delete;
                __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              uVar10 = uVar5 & 0x1ffffffffffffffe;
              local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = pdVar9;
              if (uVar5 != 1) {
                uVar15 = 0;
                do {
                  pdVar1 = (double *)((long)pdVar4 + uVar15 * 8 + uVar5 * lVar16);
                  dVar7 = pdVar1[1];
                  auVar2 = *(undefined1 (*) [16])
                            ((z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             ).m_storage.m_data + uVar15);
                  pdVar9[uVar15] = *pdVar1 - auVar2._0_8_;
                  (pdVar9 + uVar15)[1] = dVar7 - auVar2._8_8_;
                  uVar15 = uVar15 + 2;
                } while (uVar15 < uVar10);
              }
            }
            if ((long)uVar10 < (long)uVar5) {
              pdVar9 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              do {
                local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data[uVar10] =
                     *(double *)((long)pdVar4 + uVar10 * 8 + uVar5 * lVar16) - pdVar9[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar5 != uVar10);
            }
          }
          local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
               = uVar5;
          if ((local_50->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= (long)uVar8) {
LAB_0011973e:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0xad,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          local_98 = (MatrixXd *)
                     (local_50->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[uVar8];
          local_88 = (void *)0x0;
          pMStack_80 = (MatrixXd *)0x0;
          local_78 = (undefined1 *)0x0;
          local_48 = S;
          local_a0 = &local_b8;
          local_90 = (undefined1 *)&local_b8;
          local_40 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_a0);
          if (((S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows != (local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         ).m_storage.m_rows) ||
             ((S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
              != *(long *)(local_90 + 8))) {
            pcVar14 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
            ;
            goto LAB_00119895;
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)S,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                      *)&local_48);
          free(local_88);
          free(local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          uVar8 = uVar8 + 1;
          lVar16 = lVar16 + 8;
        } while (uVar8 != local_60);
      }
      local_98 = &(local_58->super_Sensor).R_;
      local_a0 = S;
      if (((S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
           (local_58->super_Sensor).R_.
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) &&
         ((S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
          (local_58->super_Sensor).R_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)S,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_a0);
        return;
      }
      pcVar14 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
      ;
LAB_00119895:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                    ,0x84,pcVar14);
    }
    pcVar14 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  local_90 = (undefined1 *)0x0;
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,pcVar14);
}

Assistant:

void LidarSensor::PredictMeasurement(const MatrixXd &Xsig_pred, const VectorXd &weights_m, const VectorXd &weights_c,
		                     MatrixXd &Zsig, VectorXd &z_pred, MatrixXd &S, bool modified) const {

    int n_z = z_pred.rows();
    int n_sigma = Zsig.cols();

    // Initialize output
    z_pred.fill(0.0);
    S.fill(0.0);

    // transform sigma points into measurement space
    for (int i=0; i<n_sigma; i++) {  // 2n+1 sigma points
	// prepare column i
	Zsig(0,i) = Xsig_pred(0,i);
	Zsig(1,i) = Xsig_pred(1,i);

        // add to mean predicted measurement
        z_pred = z_pred + weights_m(i) * Zsig.col(i);
    }

    // measurement covariance matrix S
    for (int i=(modified)?1:0; i<n_sigma; i++) {  // 2n+1 sigma points
        // residual
	VectorXd z_diff;
	if (modified)
            z_diff = Zsig.col(i) - Zsig.col(0);
	else
	    z_diff = Zsig.col(i) - z_pred;

        S = S + weights_c(i) * z_diff * z_diff.transpose();
    }

    S = S + GetR();
}